

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_HTMLparser(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  htmlDocPtr pxVar41;
  long lVar42;
  htmlParserCtxtPtr pxVar43;
  xmlDocPtr pxVar44;
  ulong uVar45;
  xmlParserCtxtPtr pxVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  int n_options;
  uint uVar49;
  undefined4 *puVar50;
  ulong *puVar51;
  undefined8 *puVar52;
  ulong uVar53;
  int n_legacy;
  uint uVar54;
  int *piVar55;
  undefined *puVar56;
  int test_ret_12;
  ulong uVar57;
  int test_ret_3;
  int iVar58;
  char *pcVar59;
  int *piVar60;
  uint *puVar61;
  int n_name;
  uint uVar62;
  undefined4 uVar63;
  undefined8 uVar64;
  int test_ret_1;
  int test_ret;
  int test_ret_6;
  int test_ret_2;
  int test_ret_19;
  int test_ret_7;
  int test_ret_4;
  undefined8 local_80;
  undefined8 local_78;
  int local_64;
  int local_44;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 37 of 43 functions ...");
  }
  iVar1 = 0;
  uVar62 = 0;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    uVar64 = 0;
    if (bVar3) {
      uVar64 = 0x15d434;
    }
    bVar4 = true;
    do {
      bVar2 = bVar4;
      iVar5 = xmlMemBlocks();
      uVar47 = 0;
      if (bVar2) {
        uVar47 = 0x15d43c;
      }
      UTF8ToHtml(0,uVar64,0,uVar47);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in UTF8ToHtml",(ulong)(uint)(iVar6 - iVar5));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      bVar4 = false;
    } while (bVar2);
    uVar62 = 1;
    bVar4 = false;
  } while (bVar3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar62 = 0;
  do {
    uVar54 = 0;
    puVar50 = &DAT_00158240;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar62 < 4) {
        uVar57 = (&DAT_0015ad60)[uVar62];
      }
      else {
        uVar57 = 0;
      }
      htmlAttrAllowed(0,uVar57,*puVar50);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar62);
        uVar57 = (ulong)uVar54;
        printf(" %d");
        putchar(10);
      }
      uVar54 = uVar54 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar62 = 0;
  do {
    puVar51 = &DAT_0015ad60;
    uVar54 = 0;
    do {
      iVar7 = (int)uVar57;
      iVar6 = xmlMemBlocks();
      pxVar41 = gen_htmlDocPtr(uVar62,iVar7);
      if (uVar54 < 4) {
        uVar57 = *puVar51;
      }
      else {
        uVar57 = 0;
      }
      htmlAutoCloseTag(pxVar41,uVar57,0);
      call_tests = call_tests + 1;
      if (((pxVar41 != (htmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
        xmlFreeDoc(pxVar41);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar7 - iVar6));
        local_64 = local_64 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        uVar57 = 0;
        printf(" %d");
        putchar(10);
      }
      uVar54 = uVar54 + 1;
      puVar51 = puVar51 + 1;
    } while (uVar54 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar62 = 0;
  do {
    puVar52 = &DAT_0015ad48;
    uVar54 = 0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar62 < 5) {
        puVar56 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar62];
      }
      else {
        puVar56 = (undefined *)0x0;
      }
      if (uVar54 < 3) {
        uVar64 = *puVar52;
      }
      else {
        uVar64 = 0;
      }
      lVar42 = htmlCreateFileParserCtxt(puVar56,uVar64);
      if (lVar42 != 0) {
        htmlFreeParserCtxt();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateFileParserCtxt",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
      }
      uVar54 = uVar54 + 1;
      puVar52 = puVar52 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 6);
  function_tests = function_tests + 1;
  iVar6 = local_64 + iVar6;
  uVar62 = 0;
  iVar7 = 0;
  do {
    piVar60 = &DAT_00158240;
    uVar54 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar62 == 0) {
        bVar4 = false;
        pcVar59 = "foo";
      }
      else if (uVar62 == 2) {
        bVar4 = false;
        pcVar59 = "test/ent2";
      }
      else if (uVar62 == 1) {
        bVar4 = false;
        pcVar59 = "<foo/>";
      }
      else {
        bVar4 = true;
        pcVar59 = (char *)0x0;
      }
      iVar10 = *piVar60;
      if ((!bVar4) && (iVar9 = xmlStrlen(pcVar59), iVar9 < iVar10)) {
        iVar10 = 0;
      }
      lVar42 = htmlCreateMemoryParserCtxt(pcVar59,iVar10);
      if (lVar42 != 0) {
        htmlFreeParserCtxt(lVar42);
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar8 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",(ulong)(uint)(iVar10 - iVar8)
              );
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d",(ulong)uVar54);
        putchar(10);
      }
      uVar54 = uVar54 + 1;
      piVar60 = piVar60 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  iVar10 = 0;
  do {
    iVar9 = 0;
    do {
      uVar62 = 0;
      do {
        uVar57 = 0;
        do {
          piVar60 = (int *)0x0;
          puVar50 = &DAT_0014c228;
          do {
            iVar11 = xmlMemBlocks();
            piVar55 = &call_tests;
            if (iVar10 != 0) {
              if (iVar10 == 1) {
                piVar55 = (int *)0xffffffffffffffff;
              }
              else {
                piVar55 = (int *)0x0;
              }
            }
            if (iVar9 == 0) {
              bVar4 = false;
              pcVar59 = "foo";
            }
            else if (iVar9 == 2) {
              bVar4 = false;
              pcVar59 = "test/ent2";
            }
            else if (iVar9 == 1) {
              bVar4 = false;
              pcVar59 = "<foo/>";
            }
            else {
              bVar4 = true;
              pcVar59 = (char *)0x0;
            }
            iVar13 = -1;
            if (uVar62 < 4) {
              iVar13 = (&DAT_00158240)[uVar62];
            }
            if ((uint)uVar57 < 5) {
              puVar56 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar57];
            }
            else {
              puVar56 = (undefined *)0x0;
            }
            uVar63 = 0xffffffff;
            uVar54 = (uint)piVar60;
            if (uVar54 < 3) {
              uVar63 = *puVar50;
            }
            if ((!bVar4) && (iVar12 = xmlStrlen(pcVar59), iVar12 < iVar13)) {
              iVar13 = 0;
            }
            lVar42 = htmlCreatePushParserCtxt(0,piVar55,pcVar59,iVar13,puVar56,uVar63);
            if (lVar42 != 0) {
              htmlFreeParserCtxt(lVar42);
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar13 = xmlMemBlocks();
            pcVar59 = (char *)piVar55;
            if (iVar11 != iVar13) {
              iVar13 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                     (ulong)(uint)(iVar13 - iVar11));
              iVar8 = iVar8 + 1;
              printf(" %d",0);
              printf(" %d",iVar10);
              printf(" %d",iVar9);
              printf(" %d",(ulong)uVar62);
              printf(" %d",uVar57);
              printf(" %d");
              putchar(10);
              pcVar59 = (char *)piVar60;
            }
            uVar54 = uVar54 + 1;
            piVar60 = (int *)(ulong)uVar54;
            puVar50 = puVar50 + 1;
          } while (uVar54 != 4);
          uVar54 = (uint)uVar57 + 1;
          uVar57 = (ulong)uVar54;
        } while (uVar54 != 6);
        uVar62 = uVar62 + 1;
      } while (uVar62 != 4);
      iVar9 = iVar9 + 1;
    } while (iVar9 != 4);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  function_tests = function_tests + 1;
  iVar9 = 0;
  iVar10 = 0;
  do {
    iVar13 = (int)pcVar59;
    iVar11 = xmlMemBlocks();
    pxVar43 = gen_htmlParserCtxtPtr(iVar10,iVar13);
    pcVar59 = (char *)0x0;
    pxVar44 = (xmlDocPtr)htmlCtxtParseDocument(pxVar43);
    if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc)) {
      xmlFreeDoc(pxVar44);
    }
    call_tests = call_tests + 1;
    if (pxVar43 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar43);
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar11 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtParseDocument",(ulong)(uint)(iVar13 - iVar11));
      iVar9 = iVar9 + 1;
      printf(" %d");
      pcVar59 = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  function_tests = function_tests + 1;
  local_38 = &DAT_0015ad60;
  iVar10 = 0;
  uVar62 = 0;
  do {
    uVar54 = 0;
    do {
      uVar57 = 0;
      do {
        uVar53 = 0;
        do {
          piVar60 = (int *)0x0;
          puVar50 = &DAT_00158240;
          do {
            iVar13 = (int)pcVar59;
            iVar11 = xmlMemBlocks();
            pxVar43 = gen_htmlParserCtxtPtr(uVar62,iVar13);
            if (uVar54 < 4) {
              pcVar59 = (char *)(&DAT_0015ad60)[uVar54];
            }
            else {
              pcVar59 = (char *)0x0;
            }
            if ((uint)uVar57 < 3) {
              uVar64 = (&DAT_0015ad48)[uVar57];
            }
            else {
              uVar64 = 0;
            }
            if ((uint)uVar53 < 3) {
              uVar47 = (&DAT_0015ad48)[uVar53];
            }
            else {
              uVar47 = 0;
            }
            pxVar44 = (xmlDocPtr)htmlCtxtReadDoc(pxVar43,pcVar59,uVar64,uVar47,*puVar50);
            if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc))
            {
              xmlFreeDoc(pxVar44);
            }
            call_tests = call_tests + 1;
            if (pxVar43 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt(pxVar43);
            }
            xmlResetLastError();
            iVar13 = xmlMemBlocks();
            iVar12 = (int)piVar60;
            if (iVar11 != iVar13) {
              iVar13 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar13 - iVar11));
              iVar10 = iVar10 + 1;
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar54);
              printf(" %d",uVar57);
              printf(" %d",uVar53);
              printf(" %d");
              putchar(10);
              pcVar59 = (char *)piVar60;
            }
            uVar49 = iVar12 + 1;
            piVar60 = (int *)(ulong)uVar49;
            puVar50 = puVar50 + 1;
          } while (uVar49 != 4);
          uVar49 = (uint)uVar53 + 1;
          uVar53 = (ulong)uVar49;
        } while (uVar49 != 4);
        uVar49 = (uint)uVar57 + 1;
        uVar57 = (ulong)uVar49;
      } while (uVar49 != 4);
      uVar54 = uVar54 + 1;
    } while (uVar54 != 5);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar11 = 0;
  do {
    uVar62 = 0;
    do {
      uVar57 = 0;
      do {
        lVar42 = 0;
        do {
          pxVar43 = gen_htmlParserCtxtPtr(iVar11,(int)pcVar59);
          if (uVar62 < 7) {
            pcVar59 = (char *)(&DAT_0015ad80)[uVar62];
          }
          else {
            pcVar59 = (char *)0x0;
          }
          if ((uint)uVar57 < 3) {
            uVar64 = (&DAT_0015ad48)[uVar57];
          }
          else {
            uVar64 = 0;
          }
          pxVar44 = (xmlDocPtr)
                    htmlCtxtReadFile(pxVar43,pcVar59,uVar64,
                                     *(undefined4 *)((long)&DAT_00158240 + lVar42));
          if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc)) {
            xmlFreeDoc(pxVar44);
          }
          call_tests = call_tests + 1;
          if (pxVar43 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar43);
          }
          xmlResetLastError();
          lVar42 = lVar42 + 4;
        } while ((int)lVar42 != 0x10);
        uVar54 = (uint)uVar57 + 1;
        uVar57 = (ulong)uVar54;
      } while (uVar54 != 4);
      uVar62 = uVar62 + 1;
    } while (uVar62 != 8);
    iVar11 = iVar11 + 1;
  } while (iVar11 != 3);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar62 = 0;
  do {
    uVar54 = 0;
    do {
      uVar57 = 0;
      do {
        uVar53 = 0;
        do {
          uVar45 = 0;
          do {
            uVar49 = 0;
            do {
              iVar13 = (int)pcVar59;
              iVar11 = xmlMemBlocks();
              pxVar43 = gen_htmlParserCtxtPtr(uVar62,iVar13);
              if (uVar54 == 0) {
                pcVar59 = "foo";
LAB_001182e9:
                bVar4 = false;
              }
              else {
                if (uVar54 == 2) {
                  pcVar59 = "test/ent2";
                  goto LAB_001182e9;
                }
                if (uVar54 == 1) {
                  bVar4 = false;
                  pcVar59 = "<foo/>";
                }
                else {
                  bVar4 = true;
                  pcVar59 = (char *)0x0;
                }
              }
              iVar13 = -1;
              if ((uint)uVar57 < 4) {
                iVar13 = (&DAT_00158240)[uVar57];
              }
              if ((uint)uVar53 < 3) {
                uVar64 = (&DAT_0015ad48)[uVar53];
              }
              else {
                uVar64 = 0;
              }
              if ((!bVar4) && (iVar12 = xmlStrlen(pcVar59), iVar12 < iVar13)) {
                iVar13 = 0;
              }
              pxVar44 = (xmlDocPtr)htmlCtxtReadMemory(pxVar43,pcVar59,iVar13,uVar64);
              if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar44);
              }
              call_tests = call_tests + 1;
              if (pxVar43 != (htmlParserCtxtPtr)0x0) {
                htmlFreeParserCtxt(pxVar43);
              }
              xmlResetLastError();
              iVar13 = xmlMemBlocks();
              if (iVar11 != iVar13) {
                iVar13 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCtxtReadMemory",
                       (ulong)(uint)(iVar13 - iVar11));
                local_44 = local_44 + 1;
                printf(" %d",(ulong)uVar62);
                printf(" %d",(ulong)uVar54);
                printf(" %d",uVar57);
                printf(" %d",uVar53);
                printf(" %d",uVar45);
                pcVar59 = (char *)(ulong)uVar49;
                printf(" %d");
                putchar(10);
              }
              uVar49 = uVar49 + 1;
            } while (uVar49 != 4);
            uVar49 = (int)uVar45 + 1;
            uVar45 = (ulong)uVar49;
          } while (uVar49 != 4);
          uVar49 = (uint)uVar53 + 1;
          uVar53 = (ulong)uVar49;
        } while (uVar49 != 4);
        uVar49 = (uint)uVar57 + 1;
        uVar57 = (ulong)uVar49;
      } while (uVar49 != 4);
      uVar54 = uVar54 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar11 = 0;
  do {
    iVar13 = xmlMemBlocks();
    pxVar43 = gen_htmlParserCtxtPtr(uVar62,(int)pcVar59);
    htmlCtxtReset(pxVar43);
    call_tests = call_tests + 1;
    if (pxVar43 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar43);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar13 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar12 - iVar13));
      iVar11 = iVar11 + 1;
      pcVar59 = (char *)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar62 = 0;
  do {
    puVar61 = &DAT_00158240;
    piVar60 = (int *)0x0;
    do {
      iVar14 = (int)pcVar59;
      iVar12 = xmlMemBlocks();
      pxVar46 = gen_xmlParserCtxtPtr(uVar62,iVar14);
      pcVar59 = (char *)(ulong)*puVar61;
      htmlCtxtSetOptions(pxVar46);
      call_tests = call_tests + 1;
      if (pxVar46 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar46);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      iVar15 = (int)piVar60;
      if (iVar12 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtSetOptions",(ulong)(uint)(iVar14 - iVar12));
        iVar13 = iVar13 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
        pcVar59 = (char *)piVar60;
      }
      uVar54 = iVar15 + 1;
      piVar60 = (int *)(ulong)uVar54;
      puVar61 = puVar61 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar62 = 0;
  do {
    puVar61 = &DAT_00158240;
    piVar60 = (int *)0x0;
    do {
      iVar15 = (int)pcVar59;
      iVar14 = xmlMemBlocks();
      pxVar43 = gen_htmlParserCtxtPtr(uVar62,iVar15);
      pcVar59 = (char *)(ulong)*puVar61;
      htmlCtxtUseOptions(pxVar43);
      call_tests = call_tests + 1;
      if (pxVar43 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt(pxVar43);
      }
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      iVar16 = (int)piVar60;
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar15 - iVar14));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar62);
        printf(" %d");
        putchar(10);
        pcVar59 = (char *)piVar60;
      }
      uVar54 = iVar16 + 1;
      piVar60 = (int *)(ulong)uVar54;
      puVar61 = puVar61 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar64 = *local_38;
    }
    else {
      uVar64 = 0;
    }
    htmlElementAllowedHere(0,uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    local_38 = local_38 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  htmlElementStatusHere(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlElementStatusHere",(ulong)(uint)(iVar17 - iVar15));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  local_80 = 0;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    local_78 = 0;
    uVar57 = 0;
    if (bVar3) {
      uVar57 = 0x15d434;
    }
    bVar4 = true;
    do {
      bVar2 = bVar4;
      uVar64 = 0;
      if (bVar2) {
        uVar64 = 0x15d43c;
      }
      puVar50 = &DAT_00158240;
      uVar53 = 0;
      do {
        iVar18 = xmlMemBlocks();
        uVar45 = uVar57;
        htmlEncodeEntities(0,uVar57,0,uVar64,*puVar50);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar19 = xmlMemBlocks();
        iVar20 = (int)uVar53;
        if (iVar18 != iVar19) {
          iVar19 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar19 - iVar18));
          iVar17 = iVar17 + 1;
          printf(" %d",0);
          printf(" %d",local_80);
          printf(" %d",0);
          printf(" %d",local_78);
          printf(" %d");
          putchar(10);
          uVar45 = uVar53;
        }
        uVar62 = iVar20 + 1;
        uVar53 = (ulong)uVar62;
        puVar50 = puVar50 + 1;
      } while (uVar62 != 4);
      local_78 = 1;
      bVar4 = false;
    } while (bVar2);
    local_80 = 1;
    bVar4 = false;
  } while (bVar3);
  function_tests = function_tests + 1;
  puVar52 = &DAT_0015ad60;
  uVar62 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar64 = *puVar52;
    }
    else {
      uVar64 = 0;
    }
    htmlEntityLookup(uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      uVar45 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar52 = puVar52 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  puVar50 = &DAT_0014c1ec;
  uVar62 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    htmlEntityValueLookup(*puVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      uVar45 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar50 = puVar50 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  puVar50 = &DAT_00158240;
  uVar62 = 0;
  iVar20 = 0;
  do {
    iVar21 = xmlMemBlocks();
    htmlHandleOmittedElem(*puVar50);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar22 - iVar21));
      iVar20 = iVar20 + 1;
      uVar45 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar50 = puVar50 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  htmlInitAutoClose();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar22 = xmlMemBlocks();
  if (iVar21 != iVar22) {
    iVar23 = xmlMemBlocks();
    uVar45 = (ulong)(uint)(iVar23 - iVar21);
    printf("Leak of %d blocks found in htmlInitAutoClose");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar58 = 0;
  iVar23 = 0;
  do {
    iVar25 = (int)uVar45;
    iVar24 = xmlMemBlocks();
    pxVar41 = gen_htmlDocPtr(iVar23,iVar25);
    uVar45 = 0;
    htmlIsAutoClosed(pxVar41);
    call_tests = call_tests + 1;
    if (((pxVar41 != (htmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
      xmlFreeDoc(pxVar41);
    }
    xmlResetLastError();
    iVar25 = xmlMemBlocks();
    if (iVar24 != iVar25) {
      iVar25 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar25 - iVar24));
      iVar58 = iVar58 + 1;
      printf(" %d");
      uVar45 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar23 = iVar23 + 1;
  } while (iVar23 != 3);
  function_tests = function_tests + 1;
  puVar52 = &DAT_0015ad60;
  uVar62 = 0;
  iVar23 = 0;
  do {
    iVar24 = xmlMemBlocks();
    if (uVar62 < 4) {
      uVar64 = *puVar52;
    }
    else {
      uVar64 = 0;
    }
    htmlIsScriptAttribute(uVar64);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar25 = xmlMemBlocks();
    if (iVar24 != iVar25) {
      iVar25 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar25 - iVar24));
      iVar23 = iVar23 + 1;
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar52 = puVar52 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar24 = xmlMemBlocks();
  lVar42 = htmlNewParserCtxt();
  if (lVar42 != 0) {
    htmlFreeParserCtxt(lVar42);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar25 = xmlMemBlocks();
  if (iVar24 != iVar25) {
    iVar26 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlNewParserCtxt",(ulong)(uint)(iVar26 - iVar24));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar26 = 0;
  do {
    iVar27 = xmlMemBlocks();
    piVar60 = &call_tests;
    if (uVar62 != 0) {
      if (uVar62 == 1) {
        piVar60 = (int *)0xffffffffffffffff;
      }
      else {
        piVar60 = (int *)0x0;
      }
    }
    lVar42 = htmlNewSAXParserCtxt(0,piVar60);
    if (lVar42 != 0) {
      htmlFreeParserCtxt();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNewSAXParserCtxt",(ulong)(uint)(iVar28 - iVar27));
      iVar26 = iVar26 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar62);
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  puVar61 = &DAT_00158240;
  uVar62 = 0;
  iVar27 = 0;
  do {
    iVar28 = xmlMemBlocks();
    pcVar59 = (char *)(ulong)*puVar61;
    htmlNodeStatus(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar29 = xmlMemBlocks();
    if (iVar28 != iVar29) {
      iVar29 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar29 - iVar28));
      iVar27 = iVar27 + 1;
      printf(" %d",0);
      pcVar59 = (char *)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
    puVar61 = puVar61 + 1;
  } while (uVar62 != 4);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar28 = 0;
  do {
    iVar29 = xmlMemBlocks();
    pxVar43 = gen_htmlParserCtxtPtr(uVar62,(int)pcVar59);
    htmlParseCharRef(pxVar43);
    call_tests = call_tests + 1;
    if (pxVar43 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar43);
    }
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar29 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar30 - iVar29));
      iVar28 = iVar28 + 1;
      pcVar59 = (char *)(ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar29 = 0;
  uVar62 = 0;
  do {
    iVar30 = 0;
    do {
      uVar57 = 0;
      do {
        puVar50 = &DAT_00158240;
        uVar54 = 0;
        do {
          iVar33 = (int)pcVar59;
          iVar31 = xmlMemBlocks();
          pxVar43 = gen_htmlParserCtxtPtr(uVar62,iVar33);
          if (iVar30 == 0) {
            bVar4 = false;
            pcVar59 = "foo";
          }
          else if (iVar30 == 2) {
            bVar4 = false;
            pcVar59 = "test/ent2";
          }
          else if (iVar30 == 1) {
            bVar4 = false;
            pcVar59 = "<foo/>";
          }
          else {
            bVar4 = true;
            pcVar59 = (char *)0x0;
          }
          iVar33 = -1;
          if ((uint)uVar57 < 4) {
            iVar33 = (&DAT_00158240)[uVar57];
          }
          uVar63 = *puVar50;
          if ((!bVar4) && (iVar32 = xmlStrlen(pcVar59), iVar32 < iVar33)) {
            iVar33 = 0;
          }
          htmlParseChunk(pxVar43,pcVar59,iVar33,uVar63);
          if (pxVar43 == (htmlParserCtxtPtr)0x0) {
            call_tests = call_tests + 1;
          }
          else {
            xmlFreeDoc(pxVar43->myDoc);
            pxVar43->myDoc = (xmlDocPtr)0x0;
            call_tests = call_tests + 1;
            htmlFreeParserCtxt(pxVar43);
          }
          xmlResetLastError();
          iVar33 = xmlMemBlocks();
          if (iVar31 != iVar33) {
            iVar33 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar33 - iVar31));
            iVar29 = iVar29 + 1;
            printf(" %d",(ulong)uVar62);
            printf(" %d",iVar30);
            printf(" %d",uVar57);
            pcVar59 = (char *)(ulong)uVar54;
            printf(" %d");
            putchar(10);
          }
          uVar54 = uVar54 + 1;
          puVar50 = puVar50 + 1;
        } while (uVar54 != 4);
        uVar54 = (uint)uVar57 + 1;
        uVar57 = (ulong)uVar54;
      } while (uVar54 != 4);
      iVar30 = iVar30 + 1;
    } while (iVar30 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar30 = 0;
  uVar62 = 0;
  do {
    puVar51 = &DAT_0015ad48;
    uVar54 = 0;
    do {
      iVar31 = xmlMemBlocks();
      if (uVar62 < 4) {
        uVar64 = (&DAT_0015ad60)[uVar62];
      }
      else {
        uVar64 = 0;
      }
      if (uVar54 < 3) {
        uVar57 = *puVar51;
      }
      else {
        uVar57 = 0;
      }
      pxVar44 = (xmlDocPtr)htmlParseDoc(uVar64);
      if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar33 = xmlMemBlocks();
      if (iVar31 != iVar33) {
        iVar33 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar33 - iVar31));
        iVar30 = iVar30 + 1;
        printf(" %d",(ulong)uVar62);
        uVar57 = (ulong)uVar54;
        printf(" %d");
        putchar(10);
      }
      uVar54 = uVar54 + 1;
      puVar51 = puVar51 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar31 = 0;
  do {
    iVar33 = xmlMemBlocks();
    pxVar43 = gen_htmlParserCtxtPtr(uVar62,(int)uVar57);
    htmlParseDocument(pxVar43);
    if (pxVar43 == (htmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar43->myDoc);
      pxVar43->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      htmlFreeParserCtxt(pxVar43);
    }
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar33 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar32 - iVar33));
      iVar31 = iVar31 + 1;
      uVar57 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  iVar33 = 0;
  do {
    iVar32 = xmlMemBlocks();
    pxVar43 = gen_htmlParserCtxtPtr(uVar62,(int)uVar57);
    htmlParseElement(pxVar43);
    call_tests = call_tests + 1;
    if (pxVar43 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar43);
    }
    xmlResetLastError();
    iVar34 = xmlMemBlocks();
    if (iVar32 != iVar34) {
      iVar34 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar34 - iVar32));
      iVar33 = iVar33 + 1;
      uVar57 = (ulong)uVar62;
      printf(" %d");
      putchar(10);
    }
    uVar62 = uVar62 + 1;
  } while (uVar62 != 3);
  function_tests = function_tests + 1;
  iVar34 = 0;
  iVar32 = 0;
  do {
    iVar36 = (int)uVar57;
    iVar35 = xmlMemBlocks();
    pxVar43 = gen_htmlParserCtxtPtr(iVar32,iVar36);
    uVar57 = 0;
    htmlParseEntityRef(pxVar43);
    call_tests = call_tests + 1;
    if (pxVar43 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar43);
    }
    xmlResetLastError();
    iVar36 = xmlMemBlocks();
    if (iVar35 != iVar36) {
      iVar36 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar36 - iVar35));
      iVar34 = iVar34 + 1;
      printf(" %d");
      uVar57 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar32 = iVar32 + 1;
  } while (iVar32 != 3);
  function_tests = function_tests + 1;
  uVar62 = 0;
  do {
    puVar52 = &DAT_0015ad48;
    uVar54 = 0;
    do {
      if (uVar62 < 7) {
        uVar64 = (&DAT_0015ad80)[uVar62];
      }
      else {
        uVar64 = 0;
      }
      if (uVar54 < 3) {
        uVar47 = *puVar52;
      }
      else {
        uVar47 = 0;
      }
      pxVar44 = (xmlDocPtr)htmlParseFile(uVar64,uVar47);
      if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      uVar54 = uVar54 + 1;
      puVar52 = puVar52 + 1;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 8);
  function_tests = function_tests + 1;
  iVar32 = 0;
  uVar62 = 0;
  do {
    uVar57 = 0;
    do {
      uVar54 = 0;
      do {
        puVar50 = &DAT_00158240;
        iVar35 = 0;
        do {
          iVar36 = xmlMemBlocks();
          if (uVar62 < 4) {
            uVar64 = (&DAT_0015ad60)[uVar62];
          }
          else {
            uVar64 = 0;
          }
          if ((uint)uVar57 < 3) {
            uVar47 = (&DAT_0015ad48)[uVar57];
          }
          else {
            uVar47 = 0;
          }
          if (uVar54 < 3) {
            uVar48 = (&DAT_0015ad48)[uVar54];
          }
          else {
            uVar48 = 0;
          }
          pxVar44 = (xmlDocPtr)htmlReadDoc(uVar64,uVar47,uVar48,*puVar50);
          if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar37 = xmlMemBlocks();
          if (iVar36 != iVar37) {
            iVar37 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar37 - iVar36));
            iVar32 = iVar32 + 1;
            printf(" %d",(ulong)uVar62);
            printf(" %d",uVar57);
            printf(" %d",(ulong)uVar54);
            printf(" %d");
            putchar(10);
          }
          iVar35 = iVar35 + 1;
          puVar50 = puVar50 + 1;
        } while (iVar35 != 4);
        uVar54 = uVar54 + 1;
      } while (uVar54 != 4);
      uVar54 = (uint)uVar57 + 1;
      uVar57 = (ulong)uVar54;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 5);
  function_tests = function_tests + 1;
  iVar35 = 0;
  uVar62 = 0;
  do {
    uVar57 = 0;
    do {
      iVar36 = 0;
      puVar50 = &DAT_00158240;
      do {
        iVar37 = xmlMemBlocks();
        if (uVar62 < 7) {
          uVar64 = (&DAT_0015ad80)[uVar62];
        }
        else {
          uVar64 = 0;
        }
        if ((uint)uVar57 < 3) {
          uVar47 = (&DAT_0015ad48)[uVar57];
        }
        else {
          uVar47 = 0;
        }
        pxVar44 = (xmlDocPtr)htmlReadFile(uVar64,uVar47,*puVar50);
        if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar38 = xmlMemBlocks();
        if (iVar37 != iVar38) {
          iVar38 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar38 - iVar37));
          iVar35 = iVar35 + 1;
          printf(" %d",(ulong)uVar62);
          printf(" %d",uVar57);
          printf(" %d");
          putchar(10);
        }
        iVar36 = iVar36 + 1;
        puVar50 = puVar50 + 1;
      } while (iVar36 != 4);
      uVar54 = (uint)uVar57 + 1;
      uVar57 = (ulong)uVar54;
    } while (uVar54 != 4);
    uVar62 = uVar62 + 1;
  } while (uVar62 != 8);
  function_tests = function_tests + 1;
  local_64 = 0;
  iVar36 = 0;
  do {
    uVar62 = 0;
    do {
      uVar54 = 0;
      do {
        uVar57 = 0;
        do {
          uVar53 = 0;
          puVar50 = &DAT_00158240;
          do {
            iVar37 = xmlMemBlocks();
            if (iVar36 == 0) {
              pcVar59 = "foo";
LAB_0011962a:
              bVar4 = false;
            }
            else {
              if (iVar36 == 2) {
                pcVar59 = "test/ent2";
                goto LAB_0011962a;
              }
              if (iVar36 == 1) {
                bVar4 = false;
                pcVar59 = "<foo/>";
              }
              else {
                bVar4 = true;
                pcVar59 = (char *)0x0;
              }
            }
            iVar38 = -1;
            if (uVar62 < 4) {
              iVar38 = (&DAT_00158240)[uVar62];
            }
            if (uVar54 < 3) {
              uVar64 = (&DAT_0015ad48)[uVar54];
            }
            else {
              uVar64 = 0;
            }
            if ((uint)uVar57 < 3) {
              uVar47 = (&DAT_0015ad48)[uVar57];
            }
            else {
              uVar47 = 0;
            }
            uVar63 = *puVar50;
            if ((!bVar4) && (iVar39 = xmlStrlen(pcVar59,uVar57,uVar64), iVar39 < iVar38)) {
              iVar38 = 0;
            }
            pxVar44 = (xmlDocPtr)htmlReadMemory(pcVar59,iVar38,uVar64,uVar47,uVar63);
            if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar38 = xmlMemBlocks();
            if (iVar37 != iVar38) {
              iVar38 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar38 - iVar37));
              local_64 = local_64 + 1;
              printf(" %d",iVar36);
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar54);
              printf(" %d",uVar57);
              printf(" %d",uVar53);
              putchar(10);
            }
            uVar49 = (int)uVar53 + 1;
            uVar53 = (ulong)uVar49;
            puVar50 = puVar50 + 1;
          } while (uVar49 != 4);
          uVar49 = (uint)uVar57 + 1;
          uVar57 = (ulong)uVar49;
        } while (uVar49 != 4);
        uVar54 = uVar54 + 1;
      } while (uVar54 != 4);
      uVar62 = uVar62 + 1;
    } while (uVar62 != 4);
    iVar36 = iVar36 + 1;
    if (iVar36 == 4) {
      function_tests = function_tests + 1;
      iVar36 = 0;
      uVar62 = 0;
      do {
        uVar54 = 0;
        do {
          iVar37 = 0;
          do {
            iVar38 = xmlMemBlocks();
            if (uVar62 < 4) {
              uVar64 = (&DAT_0015ad60)[uVar62];
            }
            else {
              uVar64 = 0;
            }
            if (uVar54 < 3) {
              uVar47 = (&DAT_0015ad48)[uVar54];
            }
            else {
              uVar47 = 0;
            }
            piVar60 = &call_tests;
            if (iVar37 != 0) {
              if (iVar37 == 1) {
                piVar60 = (int *)0xffffffffffffffff;
              }
              else {
                piVar60 = (int *)0x0;
              }
            }
            pxVar44 = (xmlDocPtr)htmlSAXParseDoc(uVar64,uVar47,0,piVar60);
            if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar39 = xmlMemBlocks();
            if (iVar38 != iVar39) {
              iVar39 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar39 - iVar38));
              iVar36 = iVar36 + 1;
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar54);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
            }
            iVar37 = iVar37 + 1;
          } while (iVar37 != 3);
          uVar54 = uVar54 + 1;
        } while (uVar54 != 4);
        uVar62 = uVar62 + 1;
      } while (uVar62 != 5);
      function_tests = function_tests + 1;
      iVar37 = 0;
      uVar62 = 0;
      do {
        uVar54 = 0;
        do {
          iVar38 = 0;
          do {
            iVar39 = xmlMemBlocks();
            if (uVar62 < 7) {
              uVar64 = (&DAT_0015ad80)[uVar62];
            }
            else {
              uVar64 = 0;
            }
            if (uVar54 < 3) {
              uVar47 = (&DAT_0015ad48)[uVar54];
            }
            else {
              uVar47 = 0;
            }
            piVar60 = &call_tests;
            if (iVar38 != 0) {
              if (iVar38 == 1) {
                piVar60 = (int *)0xffffffffffffffff;
              }
              else {
                piVar60 = (int *)0x0;
              }
            }
            pxVar44 = (xmlDocPtr)htmlSAXParseFile(uVar64,uVar47,0,piVar60);
            if (((pxVar44 != (xmlDocPtr)0x0) && (api_doc != pxVar44)) && (pxVar44->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar40 = xmlMemBlocks();
            if (iVar39 != iVar40) {
              iVar40 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar40 - iVar39));
              iVar37 = iVar37 + 1;
              printf(" %d",(ulong)uVar62);
              printf(" %d",(ulong)uVar54);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
            }
            iVar38 = iVar38 + 1;
          } while (iVar38 != 3);
          uVar54 = uVar54 + 1;
        } while (uVar54 != 4);
        uVar62 = uVar62 + 1;
      } while (uVar62 != 8);
      function_tests = function_tests + 1;
      uVar62 = iVar8 + iVar9 + iVar6 + iVar5 + iVar1 + iVar7 + iVar10 + local_44 + iVar11 + iVar13 +
               iVar12 + iVar14 + (uint)(iVar15 != iVar16) + iVar17 + iVar18 + iVar19 + iVar20 +
               (uint)(iVar21 != iVar22) + iVar58 + iVar23 + (uint)(iVar24 != iVar25) + iVar26 +
               iVar27 + iVar28 + iVar29 + iVar30 + iVar31 + iVar33 + iVar34 + iVar32 + iVar35 +
               local_64 + iVar36 + iVar37;
      if (uVar62 != 0) {
        printf("Module HTMLparser: %d errors\n",(ulong)uVar62);
      }
      return uVar62;
    }
  } while( true );
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 37 of 43 functions ...\n");
    test_ret += test_UTF8ToHtml();
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateFileParserCtxt();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtParseDocument();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtSetOptions();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlInitAutoClose();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNewSAXParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}